

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O2

int mp3dec_ex_open_buf(mp3dec_ex_t *dec,uint8_t *buf,size_t buf_size,int flags)

{
  int iVar1;
  
  if (((uint)flags < 4 && buf_size != 0xffffffffffffffff) &&
      (buf != (uint8_t *)0x0 && dec != (mp3dec_ex_t *)0x0)) {
    memset(dec,0,0x2cc0);
    (dec->file).buffer = buf;
    (dec->file).size = buf_size;
    dec->flags = flags;
    iVar1 = mp3dec_iterate_buf(buf,buf_size,mp3dec_load_index,dec);
    if ((iVar1 == 0) || (iVar1 == -4)) {
      (dec->mp3d).header[0] = '\0';
      dec->buffer_samples = 0;
      dec->indexes_built = (uint)((uint)flags < 2 && dec->vbr_tag_found == 0);
      *(byte *)&dec->flags = (byte)dec->flags & 0xfd;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int mp3dec_ex_open_buf(mp3dec_ex_t *dec, const uint8_t *buf, size_t buf_size, int flags)
{
    if (!dec || !buf || (size_t)-1 == buf_size || (flags & (~MP3D_FLAGS_MASK)))
        return MP3D_E_PARAM;
    memset(dec, 0, sizeof(*dec));
    dec->file.buffer = buf;
    dec->file.size   = buf_size;
    dec->flags       = flags;
    mp3dec_init(&dec->mp3d);
    int ret = mp3dec_iterate_buf(dec->file.buffer, dec->file.size, mp3dec_load_index, dec);
    if (ret && MP3D_E_USER != ret)
        return ret;
    mp3dec_init(&dec->mp3d);
    dec->buffer_samples = 0;
    dec->indexes_built = !(dec->vbr_tag_found || (flags & MP3D_DO_NOT_SCAN));
    dec->flags &= (~MP3D_DO_NOT_SCAN);
    return 0;
}